

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

void newcheckedkey(Table *t,TValue *key,TValue *value)

{
  uint uVar1;
  int done;
  uint i;
  TValue *value_local;
  TValue *key_local;
  Table *t_local;
  
  uVar1 = keyinarray(t,key);
  if (uVar1 == 0) {
    insertkey(t,key,value);
  }
  else {
    *(lu_byte *)((long)t->array + (ulong)(uVar1 - 1) + 4) = value->tt_;
    t->array[-1 - (ulong)(uVar1 - 1)] = value->value_;
  }
  return;
}

Assistant:

static void newcheckedkey (Table *t, const TValue *key, TValue *value) {
  unsigned i = keyinarray(t, key);
  if (i > 0)  /* is key in the array part? */
    obj2arr(t, i - 1, value);  /* set value in the array */
  else {
    int done = insertkey(t, key, value);  /* insert key in the hash part */
    lua_assert(done);  /* it cannot fail */
    cast(void, done);  /* to avoid warnings */
  }
}